

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O0

int satoko_simplify(solver_t *s)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  clause_conflict *clause_00;
  clause_conflict *clause;
  uint local_20;
  uint cref;
  uint j;
  uint i;
  solver_t *s_local;
  
  local_20 = 0;
  uVar1 = solver_dlevel(s);
  if (uVar1 != 0) {
    __assert_fail("solver_dlevel(s) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver_api.c"
                  ,0xcf,"int satoko_simplify(solver_t *)");
  }
  uVar1 = solver_propagate(s);
  if (uVar1 == 0xffffffff) {
    uVar1 = s->n_assigns_simplify;
    uVar2 = vec_uint_size(s->trail);
    if ((uVar1 == uVar2) || (0 < s->n_props_simplify)) {
      s_local._4_4_ = 1;
    }
    else {
      for (cref = 0; uVar1 = vec_uint_size(s->originals), cref < uVar1; cref = cref + 1) {
        uVar1 = vec_uint_at(s->originals,cref);
        clause_00 = clause_fetch(s,uVar1);
        iVar3 = clause_is_satisfied(s,clause_00);
        if (iVar3 == 0) {
          vec_uint_assign(s->originals,local_20,uVar1);
          local_20 = local_20 + 1;
        }
        else {
          *(uint *)clause_00 = *(uint *)clause_00 & 0xfffffffd | 2;
          (s->stats).n_original_lits = (s->stats).n_original_lits - (ulong)clause_00->size;
          clause_unwatch(s,uVar1);
        }
      }
      vec_uint_shrink(s->originals,local_20);
      solver_rebuild_order(s);
      uVar1 = vec_uint_size(s->trail);
      s->n_assigns_simplify = uVar1;
      s->n_props_simplify = (s->stats).n_original_lits + (s->stats).n_learnt_lits;
      s_local._4_4_ = 1;
    }
  }
  else {
    s_local._4_4_ = 0;
  }
  return s_local._4_4_;
}

Assistant:

int satoko_simplify(solver_t * s)
{
    unsigned i, j = 0;
    unsigned cref;

    assert(solver_dlevel(s) == 0);
    if (solver_propagate(s) != UNDEF)
        return SATOKO_ERR;
    if (s->n_assigns_simplify == vec_uint_size(s->trail) || s->n_props_simplify > 0)
        return SATOKO_OK;

    vec_uint_foreach(s->originals, cref, i) {
        struct clause *clause = clause_fetch(s, cref);

    if (clause_is_satisfied(s, clause)) {
            clause->f_mark = 1;
            s->stats.n_original_lits -= clause->size;
            clause_unwatch(s, cref);
        } else
            vec_uint_assign(s->originals, j++, cref);
    }
    vec_uint_shrink(s->originals, j);
    solver_rebuild_order(s);
    s->n_assigns_simplify = vec_uint_size(s->trail);
    s->n_props_simplify = s->stats.n_original_lits + s->stats.n_learnt_lits;
    return SATOKO_OK;
}